

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O0

void __thiscall
duckdb::WindowDistinctSortTree::BuildRun
          (WindowDistinctSortTree *this,idx_t level_nr,idx_t run_idx,
          WindowDistinctAggregatorLocalState *ldastate)

{
  undefined1 *puVar1;
  bool bVar2;
  pointer pWVar3;
  FunctionData *ptr_p;
  long lVar4;
  uchar **ppuVar5;
  long lVar6;
  uchar **ppuVar7;
  long lVar8;
  uchar **ppuVar9;
  reference this_00;
  DataChunk *pDVar10;
  size_type sVar11;
  DataChunk *this_01;
  data_ptr_t pdVar12;
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_long>_> *p_Var13;
  reference pvVar14;
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_long>_> *p_Var15;
  idx_t iVar16;
  sel_t *psVar17;
  unsigned_long uVar18;
  Vector *pVVar19;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_long>_> update_idx;
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_long>_> prev_idx;
  data_ptr_t curr_state;
  idx_t j;
  idx_t levels_flat_offset;
  unsigned_long next_limit;
  idx_t i;
  data_ptr_t prev_state;
  idx_t ncombine;
  idx_t nupdate;
  vector<unsigned_long,_true> *level;
  vector<std::tuple<unsigned_long,_unsigned_long>,_true> *zipped_level;
  MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
  *zipped_tree;
  uchar **targets;
  Vector *target_v;
  uchar **sources;
  Vector *source_v;
  uchar **updates;
  Vector *update_v;
  AggregateInputData aggr_input_data;
  SelectionVector *sel;
  DataChunk *leaves;
  WindowAggregateStates *levels_flat_native;
  DataChunk *inputs;
  ArenaAllocator *allocator;
  AggregateObject *aggr;
  size_type in_stack_fffffffffffffea8;
  WindowAggregateStates *in_stack_fffffffffffffeb0;
  code *pcVar20;
  undefined4 in_stack_fffffffffffffec8;
  sel_t in_stack_fffffffffffffecc;
  Vector *in_stack_fffffffffffffed0;
  DataChunk *count_p;
  SelectionVector *sel_vector;
  uchar *local_d0;
  unsigned_long local_c8;
  idx_t local_c0;
  optional_ptr<duckdb::FunctionData,_true> local_70;
  AggregateInputData local_68;
  SelectionVector *local_50;
  long local_48;
  long local_40;
  DataChunk *local_38;
  ArenaAllocator *local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_28 = *(long *)(in_RDI + 0x70) + 0x60;
  local_30 = (ArenaAllocator *)(*(long *)(in_RDI + 0x70) + 8);
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pWVar3 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                       *)in_stack_fffffffffffffeb0);
  local_38 = &pWVar3->chunk;
  local_40 = *(long *)(in_RDI + 0x70) + 0x3d0;
  local_48 = local_20 + 0x1a8;
  local_50 = (SelectionVector *)(local_20 + 0x1e8);
  ptr_p = AggregateObject::GetFunctionData(&in_stack_fffffffffffffeb0->aggr);
  optional_ptr<duckdb::FunctionData,_true>::optional_ptr(&local_70,ptr_p);
  AggregateInputData::AggregateInputData(&local_68,local_70,local_30,PRESERVE_INPUT);
  lVar4 = local_20 + 0x70;
  ppuVar5 = FlatVector::GetData<unsigned_char*>((Vector *)0x1a3ba5a);
  lVar6 = local_20 + 0xd8;
  ppuVar7 = FlatVector::GetData<unsigned_char*>((Vector *)0x1a3ba85);
  lVar8 = local_20 + 0x140;
  ppuVar9 = FlatVector::GetData<unsigned_char*>((Vector *)0x1a3bab0);
  this_00 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
            ::operator[]((vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                          *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
  ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_c0 = 0;
  local_c8 = 0;
  local_d0 = (uchar *)0x0;
  pDVar10 = (DataChunk *)(local_18 * *(long *)(in_RDI + 0x60));
  sVar11 = ::std::
           vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
           ::size((vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                   *)this_00);
  this_01 = (DataChunk *)
            MinValue<unsigned_long>
                      (sVar11,(long)&(pDVar10->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                              *(long *)(in_RDI + 0x60));
  sVar11 = ::std::
           vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
           ::size((vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                   *)this_00);
  sel_vector = (SelectionVector *)
               ((long)&(pDVar10->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                       .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_start + local_10 * sVar11);
  for (count_p = pDVar10; count_p < this_01;
      count_p = (DataChunk *)
                ((long)&(count_p->data).
                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                        super__Vector_impl_data._M_start + 1)) {
    sel_vector = (SelectionVector *)((long)&sel_vector->sel_vector + 1);
    pdVar12 = WindowAggregateStates::GetStatePtr
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
              ((vector<std::tuple<unsigned_long,_unsigned_long>,_true> *)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8);
    p_Var13 = ::std::get<0ul,unsigned_long,unsigned_long>
                        ((tuple<unsigned_long,_unsigned_long> *)0x1a3bbff);
    puVar1 = (undefined1 *)*p_Var13;
    pvVar14 = vector<unsigned_long,_true>::operator[]
                        ((vector<unsigned_long,_true> *)in_stack_fffffffffffffeb0,
                         in_stack_fffffffffffffea8);
    *pvVar14 = (value_type)puVar1;
    if (puVar1 < (undefined1 *)
                 ((long)&(pDVar10->data).
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_start + 1U)) {
      vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                ((vector<std::tuple<unsigned_long,_unsigned_long>,_true> *)in_stack_fffffffffffffeb0
                 ,in_stack_fffffffffffffea8);
      p_Var15 = ::std::get<1ul,unsigned_long,unsigned_long>
                          ((tuple<unsigned_long,_unsigned_long> *)0x1a3bc5f);
      iVar16 = *p_Var15;
      pWVar3 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
               operator->((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                           *)in_stack_fffffffffffffeb0);
      bVar2 = WindowCursor::RowIsVisible(pWVar3,iVar16);
      if (!bVar2) {
        DataChunk::Reference
                  ((DataChunk *)in_stack_fffffffffffffed0,
                   (DataChunk *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        DataChunk::Slice(this_01,sel_vector,(idx_t)count_p);
        pcVar20 = *(code **)(local_28 + 0xc0);
        in_stack_fffffffffffffed0 =
             ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::data
                       ((vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *)0x1a3bce0);
        iVar16 = DataChunk::ColumnCount((DataChunk *)0x1a3bcf2);
        (*pcVar20)(in_stack_fffffffffffffed0,&local_68,iVar16,lVar4,local_c0);
        local_c0 = 0;
        (**(code **)(local_28 + 200))(lVar6,lVar8,&local_68,local_c8);
        local_c8 = 0;
        unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
        operator->((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                    *)in_stack_fffffffffffffeb0);
        WindowCursor::Seek((WindowCursor *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      }
      ppuVar5[local_c0] = pdVar12;
      unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::operator->
                ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                  *)in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffecc =
           WindowCursor::RowOffset
                     ((WindowCursor *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      psVar17 = SelectionVector::operator[](local_50,local_c0);
      *psVar17 = in_stack_fffffffffffffecc;
      local_c0 = local_c0 + 1;
    }
    if (local_d0 != (uchar *)0x0) {
      ppuVar7[local_c8] = local_d0;
      ppuVar9[local_c8] = pdVar12;
      local_c8 = local_c8 + 1;
    }
    uVar18 = MaxValue<unsigned_long>(local_c8,local_c0);
    if (0x7ff < uVar18) {
      DataChunk::Reference
                ((DataChunk *)in_stack_fffffffffffffed0,
                 (DataChunk *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      DataChunk::Slice(this_01,sel_vector,(idx_t)count_p);
      pcVar20 = *(code **)(local_28 + 0xc0);
      pVVar19 = ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::data
                          ((vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *)0x1a3bebf);
      iVar16 = DataChunk::ColumnCount((DataChunk *)0x1a3bed1);
      (*pcVar20)(pVVar19,&local_68,iVar16,lVar4,local_c0);
      local_c0 = 0;
      (**(code **)(local_28 + 200))(lVar6,lVar8,&local_68,local_c8);
      local_c8 = 0;
    }
    local_d0 = pdVar12;
  }
  if ((local_c8 != 0) || (local_c0 != 0)) {
    DataChunk::Reference
              ((DataChunk *)in_stack_fffffffffffffed0,
               (DataChunk *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    DataChunk::Slice(this_01,sel_vector,(idx_t)count_p);
    pcVar20 = *(code **)(local_28 + 0xc0);
    pVVar19 = ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::data
                        ((vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *)0x1a3bfc3);
    iVar16 = DataChunk::ColumnCount((DataChunk *)0x1a3bfd4);
    (*pcVar20)(pVVar19,&local_68,iVar16,lVar4,local_c0);
    (**(code **)(local_28 + 200))(lVar6,lVar8,&local_68,local_c8);
  }
  ::std::__atomic_base<unsigned_long>::operator++((__atomic_base<unsigned_long> *)(in_RDI + 0x50));
  return;
}

Assistant:

void WindowDistinctSortTree::BuildRun(idx_t level_nr, idx_t run_idx, WindowDistinctAggregatorLocalState &ldastate) {
	auto &aggr = gdastate.aggr;
	auto &allocator = gdastate.allocator;
	auto &inputs = ldastate.cursor->chunk;
	auto &levels_flat_native = gdastate.levels_flat_native;

	//! Input data chunk, used for leaf segment aggregation
	auto &leaves = ldastate.leaves;
	auto &sel = ldastate.sel;

	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);

	//! The states to update
	auto &update_v = ldastate.update_v;
	auto updates = FlatVector::GetData<data_ptr_t>(update_v);

	auto &source_v = ldastate.source_v;
	auto sources = FlatVector::GetData<data_ptr_t>(source_v);
	auto &target_v = ldastate.target_v;
	auto targets = FlatVector::GetData<data_ptr_t>(target_v);

	auto &zipped_tree = gdastate.zipped_tree;
	auto &zipped_level = zipped_tree.tree[level_nr].first;
	auto &level = tree[level_nr].first;

	//	Reset the combine state
	idx_t nupdate = 0;
	idx_t ncombine = 0;
	data_ptr_t prev_state = nullptr;
	idx_t i = run_idx * build_run_length;
	auto next_limit = MinValue<idx_t>(zipped_level.size(), i + build_run_length);
	idx_t levels_flat_offset = level_nr * zipped_level.size() + i;
	for (auto j = i; j < next_limit; ++j) {
		//	Initialise the next aggregate
		auto curr_state = levels_flat_native.GetStatePtr(levels_flat_offset++);

		//	Update this state (if it matches)
		const auto prev_idx = std::get<0>(zipped_level[j]);
		level[j] = prev_idx;
		if (prev_idx < i + 1) {
			const auto update_idx = std::get<1>(zipped_level[j]);
			if (!ldastate.cursor->RowIsVisible(update_idx)) {
				// 	Flush if we have to move the cursor
				//	Push the updates first so they propagate
				leaves.Reference(inputs);
				leaves.Slice(sel, nupdate);
				aggr.function.update(leaves.data.data(), aggr_input_data, leaves.ColumnCount(), update_v, nupdate);
				nupdate = 0;

				//	Combine the states sequentially
				aggr.function.combine(source_v, target_v, aggr_input_data, ncombine);
				ncombine = 0;

				// Move the update into range.
				ldastate.cursor->Seek(update_idx);
			}

			updates[nupdate] = curr_state;
			//	input_idx
			sel[nupdate] = ldastate.cursor->RowOffset(update_idx);
			++nupdate;
		}

		//	Merge the previous state (if any)
		if (prev_state) {
			sources[ncombine] = prev_state;
			targets[ncombine] = curr_state;
			++ncombine;
		}
		prev_state = curr_state;

		//	Flush the states if one is maxed out.
		if (MaxValue<idx_t>(ncombine, nupdate) >= STANDARD_VECTOR_SIZE) {
			//	Push the updates first so they propagate
			leaves.Reference(inputs);
			leaves.Slice(sel, nupdate);
			aggr.function.update(leaves.data.data(), aggr_input_data, leaves.ColumnCount(), update_v, nupdate);
			nupdate = 0;

			//	Combine the states sequentially
			aggr.function.combine(source_v, target_v, aggr_input_data, ncombine);
			ncombine = 0;
		}
	}

	//	Flush any remaining states
	if (ncombine || nupdate) {
		//	Push  the updates
		leaves.Reference(inputs);
		leaves.Slice(sel, nupdate);
		aggr.function.update(leaves.data.data(), aggr_input_data, leaves.ColumnCount(), update_v, nupdate);
		nupdate = 0;

		//	Combine the states sequentially
		aggr.function.combine(source_v, target_v, aggr_input_data, ncombine);
		ncombine = 0;
	}

	++build_complete;
}